

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  int max_00;
  int iVar1;
  xmlParserCtxtPtr pxVar2;
  int newSize;
  xmlChar *tmp;
  xmlParserCtxtPtr pxStack_a8;
  int max;
  xmlChar *buffer;
  int maxLength;
  int c;
  int l;
  int len;
  xmlChar *ret;
  xmlChar buf [105];
  xmlParserCtxtPtr ctxt_local;
  
  c = 0;
  max_00 = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    max_00 = 10000000;
  }
  unique0x10000346 = ctxt;
  buffer._4_4_ = xmlCurrentChar(ctxt,&maxLength);
  do {
    iVar1 = xmlIsNameChar(stack0xffffffffffffffe8,buffer._4_4_);
    if (iVar1 == 0) {
      if (c == 0) {
        return (xmlChar *)0x0;
      }
      if (max_00 < c) {
        xmlFatalErr(stack0xffffffffffffffe8,XML_ERR_NAME_TOO_LONG,"NmToken");
        return (xmlChar *)0x0;
      }
      _l = xmlStrndup((xmlChar *)&ret,c);
      if (_l == (xmlChar *)0x0) {
        xmlErrMemory(stack0xffffffffffffffe8);
      }
      return _l;
    }
    if (buffer._4_4_ < 0x80) {
      buf[(long)c + -8] = (xmlChar)buffer._4_4_;
      c = c + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte(buf + (long)c + -8,buffer._4_4_);
      c = iVar1 + c;
    }
    if (*stack0xffffffffffffffe8->input->cur == '\n') {
      stack0xffffffffffffffe8->input->line = stack0xffffffffffffffe8->input->line + 1;
      stack0xffffffffffffffe8->input->col = 1;
    }
    else {
      stack0xffffffffffffffe8->input->col = stack0xffffffffffffffe8->input->col + 1;
    }
    stack0xffffffffffffffe8->input->cur = stack0xffffffffffffffe8->input->cur + maxLength;
    buffer._4_4_ = xmlCurrentChar(stack0xffffffffffffffe8,&maxLength);
  } while (c < 100);
  tmp._4_4_ = c << 1;
  pxStack_a8 = (xmlParserCtxtPtr)(*xmlMalloc)((long)tmp._4_4_);
  if (pxStack_a8 == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory(stack0xffffffffffffffe8);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    memcpy(pxStack_a8,&ret,(long)c);
    while (iVar1 = xmlIsNameChar(stack0xffffffffffffffe8,buffer._4_4_), iVar1 != 0) {
      pxVar2 = pxStack_a8;
      if (tmp._4_4_ < c + 10) {
        tmp._4_4_ = xmlGrowCapacity(tmp._4_4_,1,1,max_00);
        if (tmp._4_4_ < 0) {
          xmlFatalErr(stack0xffffffffffffffe8,XML_ERR_NAME_TOO_LONG,"NmToken");
          (*xmlFree)(pxStack_a8);
          return (xmlChar *)0x0;
        }
        pxVar2 = (xmlParserCtxtPtr)(*xmlRealloc)(pxStack_a8,(long)tmp._4_4_);
        if (pxVar2 == (xmlParserCtxtPtr)0x0) {
          xmlErrMemory(stack0xffffffffffffffe8);
          (*xmlFree)(pxStack_a8);
          return (xmlChar *)0x0;
        }
      }
      pxStack_a8 = pxVar2;
      if (buffer._4_4_ < 0x80) {
        *(char *)((long)&pxStack_a8->sax + (long)c) = (char)buffer._4_4_;
        c = c + 1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte((xmlChar *)((long)&pxStack_a8->sax + (long)c),buffer._4_4_);
        c = iVar1 + c;
      }
      if (*stack0xffffffffffffffe8->input->cur == '\n') {
        stack0xffffffffffffffe8->input->line = stack0xffffffffffffffe8->input->line + 1;
        stack0xffffffffffffffe8->input->col = 1;
      }
      else {
        stack0xffffffffffffffe8->input->col = stack0xffffffffffffffe8->input->col + 1;
      }
      stack0xffffffffffffffe8->input->cur = stack0xffffffffffffffe8->input->cur + maxLength;
      buffer._4_4_ = xmlCurrentChar(stack0xffffffffffffffe8,&maxLength);
    }
    *(undefined1 *)((long)&pxStack_a8->sax + (long)c) = 0;
    ctxt_local = pxStack_a8;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = xmlCurrentChar(ctxt, &l);

    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	NEXTL(l);
	c = xmlCurrentChar(ctxt, &l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		NEXTL(l);
		c = xmlCurrentChar(ctxt, &l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}